

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O0

void __thiscall VFS::CVFS::CVFSFile::Clear(CVFSFile *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  CVFSFile *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&(this->super_CVFSNode).m_UpdateLock);
  std::
  vector<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>,_std::allocator<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>_>_>
  ::clear(&this->m_Data);
  ReserveChunks(this,4);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void Clear()
                    {
                        std::lock_guard<std::mutex> lock(m_UpdateLock);
                        m_Data.clear();
                        ReserveChunks(4);
                    }